

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ItemSize(ImVec2 *size,float text_baseline_y)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if (pIVar2->SkipItems == false) {
    fVar6 = 0.0;
    if (0.0 <= text_baseline_y) {
      fVar6 = (pIVar2->DC).CurrLineTextBaseOffset - text_baseline_y;
      fVar6 = (float)(~-(uint)(fVar6 <= 0.0) & (uint)fVar6);
    }
    fVar7 = *(float *)((pIVar2->DC).MenuColumns.Widths + (ulong)(pIVar2->DC).IsSameLine * 4 + -0x3d)
    ;
    fVar5 = (pIVar2->DC).CurrLineSize.y;
    fVar6 = ((pIVar2->DC).CursorPos.y - fVar7) + size->y + fVar6;
    uVar4 = -(uint)(fVar6 <= fVar5);
    fVar1 = (pIVar2->Pos).x;
    fVar8 = (pIVar2->DC).CursorPos.x + size->x;
    (pIVar2->DC).CursorPosPrevLine.x = fVar8;
    (pIVar2->DC).CursorPosPrevLine.y = fVar7;
    fVar5 = (float)(uVar4 & (uint)fVar5 | ~uVar4 & (uint)fVar6);
    (pIVar2->DC).CursorPos.x =
         (float)(int)(fVar1 + (pIVar2->DC).Indent.x + (pIVar2->DC).ColumnsOffset.x);
    fVar7 = (float)(int)(fVar5 + fVar7 + (pIVar3->Style).ItemSpacing.y);
    (pIVar2->DC).CursorPos.y = fVar7;
    fVar6 = (pIVar2->DC).CursorMaxPos.x;
    uVar4 = -(uint)(fVar8 <= fVar6);
    (pIVar2->DC).CursorMaxPos.x = (float)(uVar4 & (uint)fVar6 | ~uVar4 & (uint)fVar8);
    fVar6 = (pIVar2->DC).CursorMaxPos.y;
    fVar7 = fVar7 - (pIVar3->Style).ItemSpacing.y;
    uVar4 = -(uint)(fVar7 <= fVar6);
    (pIVar2->DC).CursorMaxPos.y = (float)(uVar4 & (uint)fVar6 | ~uVar4 & (uint)fVar7);
    (pIVar2->DC).PrevLineSize.y = fVar5;
    (pIVar2->DC).CurrLineSize.y = 0.0;
    fVar6 = (pIVar2->DC).CurrLineTextBaseOffset;
    uVar4 = -(uint)(text_baseline_y <= fVar6);
    (pIVar2->DC).PrevLineTextBaseOffset =
         (float)(~uVar4 & (uint)text_baseline_y | (uint)fVar6 & uVar4);
    (pIVar2->DC).CurrLineTextBaseOffset = 0.0;
    (pIVar2->DC).IsSameLine = false;
    (pIVar2->DC).IsSetPos = false;
    if (((pIVar2->DC).LayoutType == 0) &&
       (pIVar2 = pIVar3->CurrentWindow, pIVar2->SkipItems == false)) {
      (pIVar2->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar2->DC).CursorPosPrevLine.x;
      (pIVar2->DC).CursorPos.y = (pIVar2->DC).CursorPosPrevLine.y;
      (pIVar2->DC).CurrLineSize = (pIVar2->DC).PrevLineSize;
      (pIVar2->DC).CurrLineTextBaseOffset = (pIVar2->DC).PrevLineTextBaseOffset;
      (pIVar2->DC).IsSameLine = true;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_baseline_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // We increase the height in this function to accommodate for baseline offset.
    // In theory we should be offsetting the starting position (window->DC.CursorPos), that will be the topic of a larger refactor,
    // but since ItemSize() is not yet an API that moves the cursor (to handle e.g. wrapping) enlarging the height has the same effect.
    const float offset_to_match_baseline_y = (text_baseline_y >= 0) ? ImMax(0.0f, window->DC.CurrLineTextBaseOffset - text_baseline_y) : 0.0f;

    const float line_y1 = window->DC.IsSameLine ? window->DC.CursorPosPrevLine.y : window->DC.CursorPos.y;
    const float line_height = ImMax(window->DC.CurrLineSize.y, /*ImMax(*/window->DC.CursorPos.y - line_y1/*, 0.0f)*/ + size.y + offset_to_match_baseline_y);

    // Always align ourselves on pixel boundaries
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = line_y1;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);    // Next line
    window->DC.CursorPos.y = IM_FLOOR(line_y1 + line_height + g.Style.ItemSpacing.y);                    // Next line
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.CurrLineSize.y = 0.0f;
    window->DC.PrevLineTextBaseOffset = ImMax(window->DC.CurrLineTextBaseOffset, text_baseline_y);
    window->DC.CurrLineTextBaseOffset = 0.0f;
    window->DC.IsSameLine = window->DC.IsSetPos = false;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}